

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall cmTestGenerator::GenerateOldStyle(cmTestGenerator *this,ostream *fout,Indent indent)

{
  char cVar1;
  cmTest *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  ostream *poVar5;
  char *__s;
  _Base_ptr p_Var6;
  pointer pbVar7;
  size_type sVar8;
  allocator<char> local_ad;
  cmScriptGeneratorIndent local_ac;
  cmTestGenerator *local_a8;
  string local_a0;
  pointer local_80;
  string *arg;
  string exe;
  string local_50;
  
  this->TestGenerated = true;
  pcVar2 = this->Test;
  local_ac.Level = indent.Level;
  local_a8 = this;
  std::__cxx11::string::string
            ((string *)&exe,
             (string *)
             (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  cmsys::SystemTools::ConvertToUnixSlashes(&exe);
  operator<<(fout,local_ac);
  std::operator<<(fout,"add_test(");
  std::__cxx11::string::string((string *)&local_a0,(string *)&local_a8->Test->Name);
  poVar5 = std::operator<<(fout,(string *)&local_a0);
  poVar5 = std::operator<<(poVar5," \"");
  poVar5 = std::operator<<(poVar5,(string *)&exe);
  std::operator<<(poVar5,"\"");
  std::__cxx11::string::~string((string *)&local_a0);
  local_80 = (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pbVar7 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar7 + 1 != local_80) {
    arg = pbVar7 + 1;
    std::operator<<(fout," \"");
    pcVar3 = pbVar7[1]._M_dataplus._M_p;
    sVar4 = pbVar7[1]._M_string_length;
    for (sVar8 = 0; sVar4 != sVar8; sVar8 = sVar8 + 1) {
      cVar1 = pcVar3[sVar8];
      if (cVar1 == '\"') {
        std::operator<<(fout,'\\');
      }
      std::operator<<(fout,cVar1);
    }
    std::operator<<(fout,"\"");
    pbVar7 = arg;
  }
  poVar5 = std::operator<<(fout,")");
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar2 = local_a8->Test;
  poVar5 = operator<<(fout,local_ac);
  poVar5 = std::operator<<(poVar5,"set_tests_properties(");
  std::__cxx11::string::string((string *)&local_a0,(string *)&local_a8->Test->Name);
  poVar5 = std::operator<<(poVar5,(string *)&local_a0);
  std::operator<<(poVar5," PROPERTIES ");
  std::__cxx11::string::~string((string *)&local_a0);
  for (p_Var6 = (pcVar2->Properties).
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 !=
      &(pcVar2->Properties).
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::operator<<(fout," ");
    poVar5 = std::operator<<(poVar5,(string *)(p_Var6 + 1));
    poVar5 = std::operator<<(poVar5," ");
    __s = cmProperty::GetValue((cmProperty *)(p_Var6 + 2));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_ad);
    cmOutputConverter::EscapeForCMake(&local_a0,&local_50);
    std::operator<<(poVar5,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  GenerateInternalProperties(local_a8,fout);
  poVar5 = std::operator<<(fout,")");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&exe);
  return;
}

Assistant:

void cmTestGenerator::GenerateOldStyle(std::ostream& fout, Indent indent)
{
  this->TestGenerated = true;

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  std::string exe = command[0];
  cmSystemTools::ConvertToUnixSlashes(exe);
  fout << indent;
  fout << "add_test(";
  fout << this->Test->GetName() << " \"" << exe << "\"";

  for (std::string const& arg : cmMakeRange(command).advance(1)) {
    // Just double-quote all arguments so they are re-parsed
    // correctly by the test system.
    fout << " \"";
    for (char c : arg) {
      // Escape quotes within arguments.  We should escape
      // backslashes too but we cannot because it makes the result
      // inconsistent with previous behavior of this command.
      if (c == '"') {
        fout << '\\';
      }
      fout << c;
    }
    fout << "\"";
  }
  fout << ")" << std::endl;

  // Output properties for the test.
  cmPropertyMap& pm = this->Test->GetProperties();
  fout << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
  for (auto const& i : pm) {
    fout << " " << i.first << " "
         << cmOutputConverter::EscapeForCMake(i.second.GetValue());
  }
  this->GenerateInternalProperties(fout);
  fout << ")" << std::endl;
}